

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

SocketAddress * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::chooseOneAddress(NetworkAddressImpl *this)

{
  uint uVar1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  _kjCondition.left = (this->addrs).size_;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.result) {
    uVar1 = this->counter;
    this->counter = uVar1 + 1;
    return (this->addrs).ptr + (ulong)uVar1 % _kjCondition.left;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x656,FAILED,"addrs.size() > 0","_kjCondition,\"No addresses available.\"",
             &_kjCondition,(char (*) [24])"No addresses available.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

const SocketAddress& chooseOneAddress() {
    KJ_REQUIRE(addrs.size() > 0, "No addresses available.");
    return addrs[counter++ % addrs.size()];
  }